

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Fx_ManUpdate(Fx_Man_t *p,int iDiv,int *fWarning)

{
  Vec_Int_t *p_00;
  Hsh_VecMan_t *pHVar1;
  Vec_Wec_t *pVVar2;
  Vec_Wec_t *pVVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  int t;
  uint uVar12;
  Vec_Int_t *pVVar13;
  Vec_Int_t *pVVar14;
  ulong uVar15;
  int *piVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  size_t sVar20;
  uint uVar21;
  uint uVar22;
  int *piVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  Vec_Int_t *pVVar28;
  undefined7 uVar30;
  int *piVar29;
  ulong uVar31;
  int *piVar32;
  long lVar33;
  bool bVar34;
  float fVar35;
  int *in_stack_ffffffffffffff80;
  Vec_Int_t *local_60;
  Vec_Int_t *local_50;
  
  if ((iDiv < 0) || (p->vWeights->nSize <= iDiv)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  fVar35 = p->vWeights->pArray[(uint)iDiv];
  fVar35 = fVar35 - (float)(int)fVar35;
  if ((fVar35 <= 0.0) || (1.0 <= fVar35)) {
    __assert_fail("Diff > 0.0 && Diff < 1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x3cb,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  p_00 = p->vDiv;
  p->nDivs = p->nDivs + 1;
  p_00->nSize = 0;
  pHVar1 = p->pHash;
  if (pHVar1->vMap->nSize <= iDiv) {
LAB_002cb992:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar7 = pHVar1->vMap->pArray[(uint)iDiv];
  if (((long)iVar7 < 0) || (pHVar1->vData->nSize <= iVar7)) {
LAB_002cbae7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar4 = pHVar1->vData->pArray + iVar7;
  iVar7 = *piVar4;
  (pHVar1->vTemp).nCap = iVar7;
  (pHVar1->vTemp).nSize = iVar7;
  (pHVar1->vTemp).pArray = piVar4 + 2;
  if (0 < iVar7) {
    lVar33 = 0;
    do {
      Vec_IntPush(p_00,(pHVar1->vTemp).pArray[lVar33]);
      lVar33 = lVar33 + 1;
    } while (lVar33 < (pHVar1->vTemp).nSize);
  }
  if ((long)p_00->nSize < 1) {
    uVar24 = 0xffffffff;
    uVar27 = 0xffffffff;
  }
  else {
    uVar24 = 0xffffffff;
    uVar27 = 0xffffffff;
    uVar31 = 1;
    do {
      uVar12 = p_00->pArray[uVar31 - 1];
      if ((int)uVar12 < 0) goto LAB_002cba6b;
      uVar22 = uVar27;
      if (uVar27 == 0xffffffff) {
        uVar22 = uVar12 >> 1;
      }
      uVar21 = uVar12 >> 1;
      if (uVar24 != 0xffffffff) {
        uVar21 = uVar24;
      }
      if ((uVar12 & 1) != 0) {
        uVar27 = uVar22;
        uVar21 = uVar24;
      }
      uVar24 = uVar21;
    } while (((int)(uVar27 | uVar24) < 0) &&
            (bVar34 = uVar31 < (ulong)(long)p_00->nSize, uVar31 = uVar31 + 1, bVar34));
  }
  if (((int)uVar24 < 0) || ((int)uVar27 < 0)) {
    __assert_fail("Lit0 >= 0 && Lit1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x3d2,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  pVVar8 = p->vCubesS;
  pVVar8->nSize = 0;
  if (p_00->nSize == 2) {
    if ((int)uVar24 < 0) goto LAB_002cb973;
    pVVar2 = p->vLits;
    uVar12 = uVar24 ^ 1;
    if (pVVar2->nSize <= (int)uVar12) goto LAB_002cb973;
    pVVar3 = p->vCubes;
    pVVar28 = pVVar2->pArray;
    uVar22 = pVVar28[uVar12].nSize;
    uVar31 = (ulong)uVar22;
    if ((int)uVar22 < 1) {
      uVar21 = 0;
    }
    else {
      piVar4 = pVVar28[uVar12].pArray;
      lVar33 = 0;
      uVar21 = 0;
      do {
        iVar7 = piVar4[lVar33];
        if (((long)iVar7 < 0) || (pVVar3->nSize <= iVar7)) goto LAB_002cb973;
        if (0 < pVVar3->pArray[iVar7].nSize) {
          if (((int)uVar21 < 0) || ((int)uVar31 <= (int)uVar21)) goto LAB_002cba0e;
          uVar31 = (ulong)uVar21;
          uVar21 = uVar21 + 1;
          piVar4[uVar31] = iVar7;
        }
        lVar33 = lVar33 + 1;
        uVar22 = pVVar28[uVar12].nSize;
        uVar31 = (ulong)(int)uVar22;
      } while (lVar33 < (long)uVar31);
    }
    if ((int)uVar22 < (int)uVar21) goto LAB_002cba2d;
    pVVar28[uVar12].nSize = uVar21;
    if (((int)uVar27 < 0) || (uVar22 = uVar27 ^ 1, pVVar2->nSize <= (int)uVar22)) goto LAB_002cb973;
    uVar21 = pVVar28[uVar22].nSize;
    uVar31 = (ulong)uVar21;
    if ((int)uVar21 < 1) {
      uVar18 = 0;
    }
    else {
      piVar4 = pVVar28[uVar22].pArray;
      lVar33 = 0;
      uVar18 = 0;
      do {
        iVar7 = piVar4[lVar33];
        if (((long)iVar7 < 0) || (pVVar3->nSize <= iVar7)) goto LAB_002cb973;
        if (0 < pVVar3->pArray[iVar7].nSize) {
          if (((int)uVar18 < 0) || ((int)uVar31 <= (int)uVar18)) goto LAB_002cba0e;
          uVar31 = (ulong)uVar18;
          uVar18 = uVar18 + 1;
          piVar4[uVar31] = iVar7;
        }
        lVar33 = lVar33 + 1;
        uVar21 = pVVar28[uVar22].nSize;
        uVar31 = (ulong)(int)uVar21;
      } while (lVar33 < (long)uVar31);
    }
    if ((int)uVar21 < (int)uVar18) goto LAB_002cba2d;
    pVVar28[uVar22].nSize = uVar18;
    if ((pVVar2->nSize <= (int)uVar12) || (pVVar2->nSize <= (int)uVar22)) goto LAB_002cb973;
    piVar23 = pVVar28[uVar12].pArray;
    piVar16 = pVVar28[uVar22].pArray;
    iVar7 = pVVar28[uVar12].nSize;
    piVar9 = piVar23 + iVar7;
    piVar4 = piVar16 + (int)uVar18;
    pVVar8->nSize = 0;
    piVar29 = piVar16;
    piVar32 = piVar23;
    if ((0 < (int)uVar18) && (0 < iVar7)) {
      do {
        iVar7 = *piVar32;
        iVar17 = *piVar16;
        if (iVar7 == iVar17) {
          Vec_IntPush(pVVar8,iVar7);
          piVar32 = piVar32 + 1;
          piVar16 = piVar16 + 1;
        }
        else if (iVar7 < iVar17) {
          piVar32 = piVar32 + 1;
          *piVar23 = iVar7;
          piVar23 = piVar23 + 1;
        }
        else {
          piVar16 = piVar16 + 1;
          *piVar29 = iVar17;
          piVar29 = piVar29 + 1;
        }
      } while ((piVar32 < piVar9) && (piVar16 < piVar4));
    }
    for (; piVar32 < piVar9; piVar32 = piVar32 + 1) {
      *piVar23 = *piVar32;
      piVar23 = piVar23 + 1;
    }
    for (; piVar16 < piVar4; piVar16 = piVar16 + 1) {
      *piVar29 = *piVar16;
      piVar29 = piVar29 + 1;
    }
    iVar7 = (int)((ulong)((long)piVar23 - (long)pVVar28[uVar12].pArray) >> 2);
    if (pVVar28[uVar12].nSize < iVar7) goto LAB_002cba2d;
    pVVar28[uVar12].nSize = iVar7;
    iVar7 = (int)((ulong)((long)piVar29 - (long)pVVar28[uVar22].pArray) >> 2);
    if (pVVar28[uVar22].nSize < iVar7) goto LAB_002cba2d;
    pVVar28[uVar22].nSize = iVar7;
  }
  pVVar2 = p->vLits;
  if (pVVar2->nSize <= (int)uVar24) goto LAB_002cb973;
  pVVar3 = p->vCubes;
  pVVar28 = pVVar2->pArray;
  pVVar8 = pVVar28 + uVar24;
  uVar12 = pVVar28[uVar24].nSize;
  uVar31 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar22 = 0;
  }
  else {
    piVar4 = pVVar8->pArray;
    lVar33 = 0;
    uVar22 = 0;
    do {
      iVar7 = piVar4[lVar33];
      if (((long)iVar7 < 0) || (pVVar3->nSize <= iVar7)) goto LAB_002cb973;
      if (0 < pVVar3->pArray[iVar7].nSize) {
        if (((int)uVar22 < 0) || ((int)uVar31 <= (int)uVar22)) goto LAB_002cba0e;
        uVar31 = (ulong)uVar22;
        uVar22 = uVar22 + 1;
        piVar4[uVar31] = iVar7;
      }
      lVar33 = lVar33 + 1;
      uVar12 = pVVar8->nSize;
      uVar31 = (ulong)(int)uVar12;
    } while (lVar33 < (long)uVar31);
  }
  if ((int)uVar12 < (int)uVar22) goto LAB_002cba2d;
  pVVar8->nSize = uVar22;
  if (pVVar2->nSize <= (int)uVar27) goto LAB_002cb973;
  pVVar14 = pVVar28 + uVar27;
  uVar12 = pVVar28[uVar27].nSize;
  uVar31 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar22 = 0;
  }
  else {
    piVar4 = pVVar14->pArray;
    lVar33 = 0;
    uVar22 = 0;
    do {
      iVar7 = piVar4[lVar33];
      if (((long)iVar7 < 0) || (pVVar3->nSize <= iVar7)) goto LAB_002cb973;
      if (0 < pVVar3->pArray[iVar7].nSize) {
        if (((int)uVar22 < 0) || ((int)uVar31 <= (int)uVar22)) goto LAB_002cba0e;
        uVar31 = (ulong)uVar22;
        uVar22 = uVar22 + 1;
        piVar4[uVar31] = iVar7;
      }
      lVar33 = lVar33 + 1;
      uVar12 = pVVar14->nSize;
      uVar31 = (ulong)(int)uVar12;
    } while (lVar33 < (long)uVar31);
  }
  if ((int)uVar12 < (int)uVar22) goto LAB_002cba2d;
  pVVar14->nSize = uVar22;
  if ((pVVar2->nSize <= (int)uVar24) || (pVVar2->nSize <= (int)uVar27)) goto LAB_002cb973;
  pVVar28 = p_00;
  Fx_ManFindCommonPairs
            (pVVar3,pVVar8,pVVar14,p->vCubesD,p->vCompls,p_00,p->vCubeFree,in_stack_ffffffffffffff80
            );
  pVVar8 = p->vCubesS;
  if (0 < pVVar8->nSize) {
    lVar33 = 0;
    do {
      iVar7 = pVVar8->pArray[lVar33];
      if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 == (Vec_Int_t *)0x0) break;
      Fx_ManCubeSingleCubeDivisors(p,pVVar8 + iVar7,1,1);
      lVar33 = lVar33 + 1;
      pVVar8 = p->vCubesS;
    } while (lVar33 < pVVar8->nSize);
  }
  pVVar8 = p->vCubesD;
  uVar12 = pVVar8->nSize;
  uVar31 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar33 = 0;
    do {
      uVar12 = (uint)uVar31;
      iVar7 = pVVar8->pArray[lVar33];
      if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
      pVVar14 = p->vCubes->pArray;
      if (pVVar14 == (Vec_Int_t *)0x0) break;
      Fx_ManCubeSingleCubeDivisors(p,pVVar14 + iVar7,1,1);
      lVar33 = lVar33 + 1;
      pVVar8 = p->vCubesD;
      uVar12 = pVVar8->nSize;
      uVar31 = (ulong)(int)uVar12;
    } while (lVar33 < (long)uVar31);
  }
  pVVar2 = p->vCubes;
  lVar33 = (long)p->vCubesS->nSize;
  if (0 < lVar33) {
    piVar4 = p->vCubesS->pArray;
    lVar25 = 0;
    do {
      iVar7 = piVar4[lVar25];
      if (((long)iVar7 < 0) || (pVVar2->nSize <= iVar7)) goto LAB_002cb973;
      pVVar28 = (Vec_Int_t *)((long)iVar7 * 0x10);
      uVar22 = *(uint *)((long)&pVVar28->nCap + (long)pVVar2->pArray);
      if ((uVar22 >> 0x1e & 1) != 0) goto LAB_002cb9d0;
      *(uint *)((long)&pVVar28->nCap + (long)pVVar2->pArray) = uVar22 | 0x40000000;
      lVar25 = lVar25 + 1;
    } while (lVar33 != lVar25);
  }
  if (0 < (int)uVar12) {
    piVar4 = pVVar8->pArray;
    uVar31 = 0;
    do {
      lVar33 = (long)piVar4[uVar31];
      if ((lVar33 < 0) || (pVVar2->nSize <= piVar4[uVar31])) goto LAB_002cb973;
      uVar22 = pVVar2->pArray[lVar33].nCap;
      if ((uVar22 >> 0x1e & 1) != 0) goto LAB_002cb9d0;
      uVar22 = uVar22 | 0x40000000;
      pVVar28 = (Vec_Int_t *)(ulong)uVar22;
      pVVar2->pArray[lVar33].nCap = uVar22;
      uVar31 = uVar31 + 1;
    } while (uVar12 != uVar31);
  }
  pVVar8 = p->vCubesS;
  if (0 < pVVar8->nSize) {
    lVar33 = 0;
    do {
      iVar7 = pVVar8->pArray[lVar33];
      if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 == (Vec_Int_t *)0x0) break;
      pVVar8 = pVVar8 + iVar7;
      if (pVVar8->nSize < 1) goto LAB_002cb992;
      iVar7 = *pVVar8->pArray;
      if (((long)iVar7 < 0) || (p->vVarCube->nSize <= iVar7)) goto LAB_002cb992;
      Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar7],pVVar8,1,1,&pVVar28->nCap);
      lVar33 = lVar33 + 1;
      pVVar8 = p->vCubesS;
    } while (lVar33 < pVVar8->nSize);
  }
  pVVar8 = p->vCubesD;
  uVar12 = pVVar8->nSize;
  uVar31 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar33 = 0;
    do {
      uVar12 = (uint)uVar31;
      iVar7 = pVVar8->pArray[lVar33];
      if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
      pVVar14 = p->vCubes->pArray;
      if (pVVar14 == (Vec_Int_t *)0x0) break;
      pVVar14 = pVVar14 + iVar7;
      if (pVVar14->nSize < 1) goto LAB_002cb992;
      iVar7 = *pVVar14->pArray;
      if (((long)iVar7 < 0) || (p->vVarCube->nSize <= iVar7)) goto LAB_002cb992;
      Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar7],pVVar14,1,1,&pVVar28->nCap);
      lVar33 = lVar33 + 1;
      pVVar8 = p->vCubesD;
      uVar12 = pVVar8->nSize;
      uVar31 = (ulong)(int)uVar12;
    } while (lVar33 < (long)uVar31);
  }
  pVVar2 = p->vCubes;
  lVar33 = (long)p->vCubesS->nSize;
  if (0 < lVar33) {
    piVar4 = p->vCubesS->pArray;
    lVar25 = 0;
    do {
      iVar7 = piVar4[lVar25];
      if (((long)iVar7 < 0) || (pVVar2->nSize <= iVar7)) goto LAB_002cb973;
      pVVar28 = (Vec_Int_t *)((long)iVar7 * 0x10);
      uVar22 = *(uint *)((long)&pVVar28->nCap + (long)pVVar2->pArray);
      if ((uVar22 >> 0x1e & 1) == 0) goto LAB_002cb9ef;
      *(uint *)((long)&pVVar28->nCap + (long)pVVar2->pArray) = uVar22 & 0xbfffffff;
      lVar25 = lVar25 + 1;
    } while (lVar33 != lVar25);
  }
  if (0 < (int)uVar12) {
    piVar4 = pVVar8->pArray;
    uVar31 = 0;
    do {
      lVar33 = (long)piVar4[uVar31];
      if ((lVar33 < 0) || (pVVar2->nSize <= piVar4[uVar31])) goto LAB_002cb973;
      uVar22 = pVVar2->pArray[lVar33].nCap;
      if ((uVar22 >> 0x1e & 1) == 0) goto LAB_002cb9ef;
      uVar22 = uVar22 & 0xbfffffff;
      pVVar28 = (Vec_Int_t *)(ulong)uVar22;
      pVVar2->pArray[lVar33].nCap = uVar22;
      uVar31 = uVar31 + 1;
    } while (uVar12 != uVar31);
  }
  if ((uVar27 ^ uVar24) < 2) {
    pHVar1 = p->pHash;
    if (pHVar1->vMap->nSize <= iDiv) goto LAB_002cb992;
    iVar7 = pHVar1->vMap->pArray[(uint)iDiv];
    if (((long)iVar7 < 0) || (pHVar1->vData->nSize <= iVar7)) goto LAB_002cbae7;
    piVar4 = pHVar1->vData->pArray + iVar7;
    iVar7 = *piVar4;
    (pHVar1->vTemp).nCap = iVar7;
    (pHVar1->vTemp).nSize = iVar7;
    (pHVar1->vTemp).pArray = piVar4 + 2;
    if (iVar7 != 2) goto LAB_002ca9f7;
    local_50 = (Vec_Int_t *)0x0;
    local_60 = (Vec_Int_t *)0x0;
    iVar17 = 0;
  }
  else {
LAB_002ca9f7:
    iVar7 = p->vLits->nSize;
    iVar17 = iVar7 / 2;
    if (p->vVarCube->nSize != iVar17) {
      __assert_fail("Vec_IntSize(p->vVarCube) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                    ,0x3fc,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
    }
    Vec_IntPush(p->vVarCube,pVVar2->nSize);
    pVVar8 = Vec_WecPushLevel(p->vCubes);
    Vec_IntPush(pVVar8,iVar17);
    if (p_00->nSize == 2) {
      Vec_IntPush(pVVar8,uVar24 ^ 1);
      Vec_IntPush(pVVar8,uVar27 ^ 1);
      iVar19 = 1;
      if (1 < (long)pVVar8->nSize) {
        iVar19 = 0;
        lVar33 = 1;
        do {
          if (pVVar8->pArray[lVar33] < 0) goto LAB_002cba4c;
          uVar12 = (uint)pVVar8->pArray[lVar33] >> 1;
          if (p->vLevels->nSize <= (int)uVar12) goto LAB_002cb992;
          pVVar28 = (Vec_Int_t *)p->vLevels->pArray;
          if (iVar19 <= (&pVVar28->nCap)[uVar12]) {
            iVar19 = (&pVVar28->nCap)[uVar12];
          }
          lVar33 = lVar33 + 1;
        } while (pVVar8->nSize != lVar33);
        iVar19 = iVar19 + 1;
      }
    }
    else {
      pVVar8 = Vec_WecPushLevel(p->vCubes);
      lVar33 = (long)p->vCubes->nSize;
      if (lVar33 < 2) goto LAB_002cb973;
      pVVar14 = p->vCubes->pArray;
      Vec_IntPush(pVVar8,iVar17);
      if (0 < p_00->nSize) {
        lVar25 = 0;
        do {
          uVar12 = p_00->pArray[lVar25];
          if ((int)uVar12 < 0) {
LAB_002cba6b:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          pVVar11 = pVVar8;
          if ((uVar12 & 1) == 0) {
            pVVar11 = pVVar14 + lVar33 + -2;
          }
          Vec_IntPush(pVVar11,uVar12 >> 1);
          lVar25 = lVar25 + 1;
        } while (lVar25 < p_00->nSize);
        if ((p_00->nSize == 4) && (pVVar14[lVar33 + -2].nSize == 3)) {
          if (pVVar8->nSize != 3) {
            __assert_fail("Vec_IntSize(vCube2) == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                          ,0x2b3,"void Fx_ManDivAddLits(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
          }
          piVar4 = pVVar14[lVar33 + -2].pArray;
          iVar19 = piVar4[1];
          if (piVar4[2] < iVar19) {
            piVar4[1] = piVar4[2];
            piVar4[2] = iVar19;
          }
          piVar4 = pVVar8->pArray;
          iVar19 = piVar4[1];
          if (piVar4[2] < iVar19) {
            piVar4[1] = piVar4[2];
            piVar4[2] = iVar19;
          }
        }
      }
      uVar22 = 0;
      uVar12 = 0;
      if (1 < (long)pVVar14[lVar33 + -2].nSize) {
        uVar12 = 0;
        lVar25 = 1;
        do {
          if (pVVar14[lVar33 + -2].pArray[lVar25] < 0) goto LAB_002cba4c;
          uVar21 = (uint)pVVar14[lVar33 + -2].pArray[lVar25] >> 1;
          if (p->vLevels->nSize <= (int)uVar21) goto LAB_002cb992;
          uVar21 = p->vLevels->pArray[uVar21];
          pVVar28 = (Vec_Int_t *)(ulong)uVar21;
          if ((int)uVar12 <= (int)uVar21) {
            uVar12 = uVar21;
          }
          lVar25 = lVar25 + 1;
        } while (pVVar14[lVar33 + -2].nSize != lVar25);
      }
      if (1 < (long)pVVar8->nSize) {
        uVar22 = 0;
        lVar33 = 1;
        do {
          if (pVVar8->pArray[lVar33] < 0) goto LAB_002cba4c;
          uVar21 = (uint)pVVar8->pArray[lVar33] >> 1;
          if (p->vLevels->nSize <= (int)uVar21) goto LAB_002cb992;
          uVar21 = p->vLevels->pArray[uVar21];
          pVVar28 = (Vec_Int_t *)(ulong)uVar21;
          if ((int)uVar22 <= (int)uVar21) {
            uVar22 = uVar21;
          }
          lVar33 = lVar33 + 1;
        } while (pVVar8->nSize != lVar33);
      }
      if ((int)uVar22 < (int)uVar12) {
        uVar22 = uVar12;
      }
      iVar19 = uVar22 + 2;
    }
    if (p->vLevels->nSize != iVar17) {
      __assert_fail("Vec_IntSize(p->vLevels) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                    ,0x40e,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
    }
    Vec_IntPush(p->vLevels,iVar19);
    p->nLits = p->nLits + p_00->nSize;
    Vec_WecPushLevel(p->vLits);
    local_50 = Vec_WecPushLevel(p->vLits);
    lVar33 = (long)p->vLits->nSize;
    if (lVar33 < 2) goto LAB_002cb973;
    local_60 = p->vLits->pArray + lVar33 + -2;
    pVVar8 = p->vCubesS;
    if (0 < pVVar8->nSize) {
      lVar33 = 0;
      do {
        iVar19 = pVVar8->pArray[lVar33];
        if (((long)iVar19 < 0) || (p->vCubes->nSize <= iVar19)) goto LAB_002cb973;
        pVVar8 = p->vCubes->pArray;
        if (pVVar8 == (Vec_Int_t *)0x0) break;
        pVVar8 = pVVar8 + iVar19;
        iVar19 = pVVar8->nSize;
        uVar31 = (ulong)iVar19;
        iVar5 = 0;
        iVar6 = 0;
        if (1 < (long)uVar31) {
          piVar4 = pVVar8->pArray;
          uVar30 = (undefined7)((ulong)pVVar28 >> 8);
          if ((piVar4[1] ^ uVar24) == 1) {
            pVVar28 = (Vec_Int_t *)CONCAT71(uVar30,1);
            uVar26 = 1;
            uVar15 = 2;
          }
          else {
            uVar15 = 2;
            do {
              uVar26 = uVar15;
              if (uVar31 == uVar26) {
                iVar6 = 0;
                goto LAB_002cad9d;
              }
              uVar15 = uVar26 + 1;
            } while ((piVar4[uVar26] ^ uVar24) != 1);
            pVVar28 = (Vec_Int_t *)CONCAT71(uVar30,uVar26 < uVar31);
          }
          iVar6 = 0;
          if ((char)pVVar28 != '\0') {
            if ((int)uVar26 + 1 < iVar19) {
              piVar9 = piVar4 + uVar26;
              do {
                *piVar9 = piVar4[uVar15];
                uVar15 = uVar15 + 1;
                iVar19 = pVVar8->nSize;
                piVar9 = piVar9 + 1;
              } while ((int)uVar15 < iVar19);
            }
            pVVar8->nSize = iVar19 + -1;
            iVar6 = 1;
          }
        }
LAB_002cad9d:
        iVar19 = pVVar8->nSize;
        uVar31 = (ulong)iVar19;
        if (1 < (long)uVar31) {
          piVar4 = pVVar8->pArray;
          uVar30 = (undefined7)((ulong)pVVar28 >> 8);
          if ((piVar4[1] ^ uVar27) == 1) {
            pVVar28 = (Vec_Int_t *)CONCAT71(uVar30,1);
            uVar26 = 1;
            uVar15 = 2;
          }
          else {
            uVar15 = 2;
            do {
              uVar26 = uVar15;
              if (uVar31 == uVar26) goto LAB_002cae1e;
              uVar15 = uVar26 + 1;
            } while ((piVar4[uVar26] ^ uVar27) != 1);
            pVVar28 = (Vec_Int_t *)CONCAT71(uVar30,uVar26 < uVar31);
          }
          if ((char)pVVar28 != '\0') {
            if ((int)uVar26 + 1 < iVar19) {
              piVar9 = piVar4 + uVar26;
              do {
                *piVar9 = piVar4[uVar15];
                uVar15 = uVar15 + 1;
                iVar19 = pVVar8->nSize;
                piVar9 = piVar9 + 1;
              } while ((int)uVar15 < iVar19);
            }
            pVVar8->nSize = iVar19 + -1;
            iVar5 = 1;
          }
        }
LAB_002cae1e:
        if (iVar5 + iVar6 != 2) {
          __assert_fail("RetValue == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                        ,0x41b,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
        }
        if (iVar7 < -1) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(pVVar8,iVar17 * 2);
        pVVar14 = p->vCubes->pArray;
        if ((pVVar8 < pVVar14) || (pVVar14 + p->vCubes->nSize <= pVVar8)) goto LAB_002cb9b1;
        Vec_IntPush(local_60,(int)((ulong)((long)pVVar8 - (long)pVVar14) >> 4));
        p->nLits = p->nLits + -1;
        lVar33 = lVar33 + 1;
        pVVar8 = p->vCubesS;
      } while (lVar33 < pVVar8->nSize);
    }
  }
  p->nCompls = 0;
  uVar24 = p->vCubesD->nSize;
  if ((uVar24 & 1) != 0) {
    __assert_fail("Vec_IntSize(p->vCubesD) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x424,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  if (uVar24 != p->vCompls->nSize * 2) {
    __assert_fail("Vec_IntSize(p->vCubesD) == 2 * Vec_IntSize(p->vCompls)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x425,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  pVVar8 = p->vCubesD;
  iVar7 = pVVar8->nSize;
  if (iVar7 < 1) {
    uVar31 = 0;
  }
  else {
    uVar15 = 0;
    uVar31 = 0;
    do {
      if ((long)p->vCompls->nSize <= (long)(uVar15 >> 1)) goto LAB_002cb992;
      iVar19 = p->vCompls->pArray[uVar15 >> 1];
      p->nCompls = p->nCompls + iVar19;
      iVar5 = pVVar8->pArray[uVar15];
      if ((long)iVar5 < 0) goto LAB_002cb973;
      iVar6 = p->vCubes->nSize;
      if (iVar6 <= iVar5) goto LAB_002cb973;
      if ((long)iVar7 <= (long)(uVar15 | 1)) goto LAB_002cb992;
      iVar7 = pVVar8->pArray[uVar15 | 1];
      if (((long)iVar7 < 0) || (iVar6 <= iVar7)) goto LAB_002cb973;
      pVVar8 = p->vCubes->pArray;
      pVVar14 = pVVar8 + iVar5;
      pVVar8 = pVVar8 + iVar7;
      iVar5 = Fx_ManDivRemoveLits(pVVar14,p_00,iVar19);
      iVar6 = Fx_ManDivRemoveLits(pVVar8,p_00,iVar19);
      iVar7 = p_00->nSize;
      if ((iVar6 + iVar5 != iVar7) && (iVar6 + iVar5 != iVar7 + 1)) {
        __assert_fail("RetValue == Vec_IntSize(vDiv) || RetValue == Vec_IntSize( vDiv ) + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                      ,0x42e,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
      }
      if (0 < iVar17) {
        if ((iVar7 == 2) || (iVar19 != 0)) {
          Vec_IntPush(pVVar14,iVar17 * 2 + 1);
          pVVar11 = p->vCubes->pArray;
          if (pVVar14 < pVVar11) goto LAB_002cb9b1;
          pVVar13 = pVVar11 + p->vCubes->nSize;
          pVVar10 = local_50;
        }
        else {
          Vec_IntPush(pVVar14,iVar17 * 2);
          pVVar11 = p->vCubes->pArray;
          if (pVVar14 < pVVar11) goto LAB_002cb9b1;
          pVVar13 = pVVar11 + p->vCubes->nSize;
          pVVar10 = local_60;
        }
        if (pVVar13 <= pVVar14) goto LAB_002cb9b1;
        Vec_IntPush(pVVar10,(int)((ulong)((long)pVVar14 - (long)pVVar11) >> 4));
      }
      p->nLits = (p->nLits - (p_00->nSize + pVVar8->nSize)) + 2;
      pVVar11 = p->vCubes->pArray;
      if ((pVVar14 < pVVar11) || (pVVar11 + p->vCubes->nSize <= pVVar14)) goto LAB_002cb9b1;
      if ((long)p->vCubesD->nSize <= (long)uVar31) {
LAB_002cba0e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p->vCubesD->pArray[uVar31] = (int)((ulong)((long)pVVar14 - (long)pVVar11) >> 4);
      uVar31 = uVar31 + 1;
      pVVar8->nSize = 0;
      uVar15 = uVar15 + 2;
      pVVar8 = p->vCubesD;
      iVar7 = pVVar8->nSize;
    } while ((int)uVar15 < iVar7);
  }
  iVar17 = (int)uVar31;
  if (iVar17 != iVar7 / 2) {
    __assert_fail("k == Vec_IntSize(p->vCubesD) / 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x442,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  if (iVar7 < iVar17) {
LAB_002cba2d:
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar8->nSize = iVar17;
  qsort(pVVar8->pArray,uVar31 & 0xffffffff,4,Vec_IntSortCompare1);
  pVVar8 = p->vCubesS;
  if (0 < pVVar8->nSize) {
    lVar33 = 0;
    do {
      iVar7 = pVVar8->pArray[lVar33];
      if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 == (Vec_Int_t *)0x0) break;
      Fx_ManCubeSingleCubeDivisors(p,pVVar8 + iVar7,0,1);
      lVar33 = lVar33 + 1;
      pVVar8 = p->vCubesS;
    } while (lVar33 < pVVar8->nSize);
  }
  pVVar8 = p->vCubesD;
  uVar24 = pVVar8->nSize;
  uVar31 = (ulong)uVar24;
  if (0 < (int)uVar24) {
    lVar33 = 0;
    do {
      uVar24 = (uint)uVar31;
      iVar7 = pVVar8->pArray[lVar33];
      if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
      pVVar14 = p->vCubes->pArray;
      if (pVVar14 == (Vec_Int_t *)0x0) break;
      Fx_ManCubeSingleCubeDivisors(p,pVVar14 + iVar7,0,1);
      lVar33 = lVar33 + 1;
      pVVar8 = p->vCubesD;
      uVar24 = pVVar8->nSize;
      uVar31 = (ulong)(int)uVar24;
    } while (lVar33 < (long)uVar31);
  }
  pVVar2 = p->vCubes;
  lVar33 = (long)p->vCubesS->nSize;
  if (0 < lVar33) {
    piVar4 = p->vCubesS->pArray;
    lVar25 = 0;
    do {
      iVar7 = piVar4[lVar25];
      if (((long)iVar7 < 0) || (pVVar2->nSize <= iVar7)) goto LAB_002cb973;
      pVVar28 = (Vec_Int_t *)((long)iVar7 * 0x10);
      uVar27 = *(uint *)((long)&pVVar28->nCap + (long)pVVar2->pArray);
      if ((uVar27 >> 0x1e & 1) != 0) goto LAB_002cb9d0;
      *(uint *)((long)&pVVar28->nCap + (long)pVVar2->pArray) = uVar27 | 0x40000000;
      lVar25 = lVar25 + 1;
    } while (lVar33 != lVar25);
  }
  if (0 < (int)uVar24) {
    piVar4 = pVVar8->pArray;
    uVar31 = 0;
    do {
      lVar33 = (long)piVar4[uVar31];
      if ((lVar33 < 0) || (pVVar2->nSize <= piVar4[uVar31])) goto LAB_002cb973;
      uVar27 = pVVar2->pArray[lVar33].nCap;
      if ((uVar27 >> 0x1e & 1) != 0) {
LAB_002cb9d0:
        __assert_fail("!Vec_WecIntHasMark( vCube )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x2b6,"void Vec_WecMarkLevels(Vec_Wec_t *, Vec_Int_t *)");
      }
      uVar27 = uVar27 | 0x40000000;
      pVVar28 = (Vec_Int_t *)(ulong)uVar27;
      pVVar2->pArray[lVar33].nCap = uVar27;
      uVar31 = uVar31 + 1;
    } while (uVar24 != uVar31);
  }
  pVVar8 = p->vCubesS;
  if (0 < pVVar8->nSize) {
    lVar33 = 0;
    do {
      iVar7 = pVVar8->pArray[lVar33];
      if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
      pVVar8 = p->vCubes->pArray;
      if (pVVar8 == (Vec_Int_t *)0x0) break;
      pVVar8 = pVVar8 + iVar7;
      if (pVVar8->nSize < 1) goto LAB_002cb992;
      iVar7 = *pVVar8->pArray;
      if (((long)iVar7 < 0) || (p->vVarCube->nSize <= iVar7)) goto LAB_002cb992;
      Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar7],pVVar8,0,1,&pVVar28->nCap);
      lVar33 = lVar33 + 1;
      pVVar8 = p->vCubesS;
    } while (lVar33 < pVVar8->nSize);
  }
  pVVar8 = p->vCubesD;
  uVar24 = pVVar8->nSize;
  uVar31 = (ulong)uVar24;
  if (0 < (int)uVar24) {
    lVar33 = 0;
    do {
      uVar24 = (uint)uVar31;
      iVar7 = pVVar8->pArray[lVar33];
      if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
      pVVar14 = p->vCubes->pArray;
      if (pVVar14 == (Vec_Int_t *)0x0) break;
      pVVar14 = pVVar14 + iVar7;
      if (pVVar14->nSize < 1) goto LAB_002cb992;
      iVar7 = *pVVar14->pArray;
      if (((long)iVar7 < 0) || (p->vVarCube->nSize <= iVar7)) goto LAB_002cb992;
      Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar7],pVVar14,0,1,&pVVar28->nCap);
      lVar33 = lVar33 + 1;
      pVVar8 = p->vCubesD;
      uVar24 = pVVar8->nSize;
      uVar31 = (ulong)(int)uVar24;
    } while (lVar33 < (long)uVar31);
  }
  pVVar2 = p->vCubes;
  lVar33 = (long)p->vCubesS->nSize;
  if (0 < lVar33) {
    piVar4 = p->vCubesS->pArray;
    lVar25 = 0;
    do {
      iVar7 = piVar4[lVar25];
      if (((long)iVar7 < 0) || (pVVar2->nSize <= iVar7)) goto LAB_002cb973;
      pVVar28 = (Vec_Int_t *)((long)iVar7 * 0x10);
      uVar27 = *(uint *)((long)&pVVar28->nCap + (long)pVVar2->pArray);
      if ((uVar27 >> 0x1e & 1) == 0) goto LAB_002cb9ef;
      *(uint *)((long)&pVVar28->nCap + (long)pVVar2->pArray) = uVar27 & 0xbfffffff;
      lVar25 = lVar25 + 1;
    } while (lVar33 != lVar25);
  }
  if (0 < (int)uVar24) {
    piVar4 = pVVar8->pArray;
    uVar31 = 0;
    do {
      lVar33 = (long)piVar4[uVar31];
      if ((lVar33 < 0) || (pVVar2->nSize <= piVar4[uVar31])) goto LAB_002cb973;
      uVar27 = pVVar2->pArray[lVar33].nCap;
      if ((uVar27 >> 0x1e & 1) == 0) {
LAB_002cb9ef:
        __assert_fail("Vec_WecIntHasMark( vCube )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x2c0,"void Vec_WecUnmarkLevels(Vec_Wec_t *, Vec_Int_t *)");
      }
      uVar27 = uVar27 & 0xbfffffff;
      pVVar28 = (Vec_Int_t *)(ulong)uVar27;
      pVVar2->pArray[lVar33].nCap = uVar27;
      uVar31 = uVar31 + 1;
    } while (uVar24 != uVar31);
  }
  pVVar8 = p->vSCC;
  uVar24 = pVVar8->nSize;
  if ((ulong)uVar24 != 0) {
    if (1 < (int)uVar24) {
      qsort(pVVar8->pArray,(ulong)uVar24,4,Vec_IntSortCompare1);
      iVar7 = 1;
      if (1 < pVVar8->nSize) {
        piVar4 = pVVar8->pArray;
        lVar33 = 1;
        do {
          if (piVar4[lVar33] != piVar4[lVar33 + -1]) {
            lVar25 = (long)iVar7;
            iVar7 = iVar7 + 1;
            piVar4[lVar25] = piVar4[lVar33];
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 < pVVar8->nSize);
      }
      pVVar8->nSize = iVar7;
    }
    pVVar8 = p->vSCC;
    if (0 < pVVar8->nSize) {
      lVar33 = 0;
      do {
        iVar7 = pVVar8->pArray[lVar33];
        if (((long)iVar7 < 0) || (p->vCubes->nSize <= iVar7)) goto LAB_002cb973;
        pVVar14 = p->vCubes->pArray;
        if (pVVar14 == (Vec_Int_t *)0x0) break;
        pVVar14 = pVVar14 + iVar7;
        if (pVVar14->nSize < 1) goto LAB_002cb992;
        iVar7 = *pVVar14->pArray;
        if (((long)iVar7 < 0) || (p->vVarCube->nSize <= iVar7)) goto LAB_002cb992;
        Fx_ManCubeDoubleCubeDivisors(p,p->vVarCube->pArray[iVar7],pVVar14,1,1,&pVVar28->nCap);
        pVVar14->nSize = 0;
        lVar33 = lVar33 + 1;
        pVVar8 = p->vSCC;
      } while (lVar33 < pVVar8->nSize);
    }
    pVVar8->nSize = 0;
  }
  if (2 < p_00->nSize) {
    lVar33 = (long)p->vCubes->nSize;
    if (lVar33 < 2) {
LAB_002cb973:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar8 = p->vCubes->pArray;
    pVVar28 = pVVar8 + lVar33 + -2;
    pVVar14 = pVVar8 + lVar33 + -1;
    Fx_ManCubeSingleCubeDivisors(p,pVVar28,0,1);
    Fx_ManCubeSingleCubeDivisors(p,pVVar14,0,1);
    if (1 < pVVar8[lVar33 + -2].nSize) {
      lVar25 = 1;
      do {
        pVVar11 = p->vCubes->pArray;
        if ((pVVar28 < pVVar11) || (pVVar11 + p->vCubes->nSize <= pVVar28)) goto LAB_002cb9b1;
        uVar24 = pVVar8[lVar33 + -2].pArray[lVar25];
        pVVar2 = p->vLits;
        if (pVVar2->nSize <= (int)uVar24) {
          iVar17 = uVar24 + 1;
          iVar7 = pVVar2->nSize * 2;
          if (iVar7 <= iVar17) {
            iVar7 = iVar17;
          }
          if (pVVar2->nCap < iVar7) {
            sVar20 = (long)iVar7 << 4;
            if (pVVar2->pArray == (Vec_Int_t *)0x0) {
              pVVar10 = (Vec_Int_t *)malloc(sVar20);
            }
            else {
              pVVar10 = (Vec_Int_t *)realloc(pVVar2->pArray,sVar20);
            }
            pVVar2->pArray = pVVar10;
            memset(pVVar10 + pVVar2->nCap,0,((long)iVar7 - (long)pVVar2->nCap) * 0x10);
            pVVar2->nCap = iVar7;
          }
          pVVar2->nSize = iVar17;
        }
        if (((int)uVar24 < 0) || (pVVar2->nSize <= (int)uVar24)) goto LAB_002cb973;
        Vec_IntPush(pVVar2->pArray + uVar24,(int)((ulong)((long)pVVar28 - (long)pVVar11) >> 4));
        lVar25 = lVar25 + 1;
      } while (lVar25 < pVVar8[lVar33 + -2].nSize);
    }
    if (1 < pVVar8[lVar33 + -1].nSize) {
      lVar25 = 1;
      do {
        pVVar28 = p->vCubes->pArray;
        if ((pVVar14 < pVVar28) || (pVVar28 + p->vCubes->nSize <= pVVar14)) {
LAB_002cb9b1:
          __assert_fail("p->pArray <= vLevel && vLevel < p->pArray + p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0xba,"int Vec_WecLevelId(Vec_Wec_t *, Vec_Int_t *)");
        }
        uVar24 = pVVar8[lVar33 + -1].pArray[lVar25];
        pVVar2 = p->vLits;
        if (pVVar2->nSize <= (int)uVar24) {
          iVar17 = uVar24 + 1;
          iVar7 = pVVar2->nSize * 2;
          if (iVar7 <= iVar17) {
            iVar7 = iVar17;
          }
          if (pVVar2->nCap < iVar7) {
            sVar20 = (long)iVar7 << 4;
            if (pVVar2->pArray == (Vec_Int_t *)0x0) {
              pVVar11 = (Vec_Int_t *)malloc(sVar20);
            }
            else {
              pVVar11 = (Vec_Int_t *)realloc(pVVar2->pArray,sVar20);
            }
            pVVar2->pArray = pVVar11;
            memset(pVVar11 + pVVar2->nCap,0,((long)iVar7 - (long)pVVar2->nCap) * 0x10);
            pVVar2->nCap = iVar7;
          }
          pVVar2->nSize = iVar17;
        }
        if (((int)uVar24 < 0) || (pVVar2->nSize <= (int)uVar24)) goto LAB_002cb973;
        Vec_IntPush(pVVar2->pArray + uVar24,(int)((ulong)((long)pVVar14 - (long)pVVar28) >> 4));
        lVar25 = lVar25 + 1;
      } while (lVar25 < pVVar8[lVar33 + -1].nSize);
    }
  }
  if (0 < p_00->nSize) {
    piVar4 = p_00->pArray;
    pVVar2 = p->vLits;
    uVar31 = 0;
    do {
      if (piVar4[uVar31] < 0) {
LAB_002cba4c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar24 = (uint)piVar4[uVar31] >> 1;
      if (pVVar2->nSize <= (int)uVar24) goto LAB_002cb973;
      pVVar8 = pVVar2->pArray;
      pVVar28 = p->vCubesD;
      piVar9 = pVVar8[uVar24].pArray;
      piVar23 = pVVar28->pArray;
      iVar7 = pVVar8[uVar24].nSize;
      iVar17 = pVVar28->nSize;
      piVar16 = piVar9;
      piVar29 = piVar9;
      if (0 < iVar17 && 0 < (long)iVar7) {
        piVar32 = piVar23;
        do {
          iVar19 = *piVar29;
          if (iVar19 == *piVar32) {
            piVar29 = piVar29 + 1;
LAB_002cb850:
            piVar32 = piVar32 + 1;
          }
          else {
            if (*piVar32 <= iVar19) goto LAB_002cb850;
            piVar29 = piVar29 + 1;
            *piVar16 = iVar19;
            piVar16 = piVar16 + 1;
          }
        } while ((piVar29 < piVar9 + iVar7) && (piVar32 < piVar23 + iVar17));
      }
      for (; piVar29 < piVar9 + iVar7; piVar29 = piVar29 + 1) {
        *piVar16 = *piVar29;
        piVar16 = piVar16 + 1;
      }
      iVar7 = (int)((ulong)((long)piVar16 - (long)piVar9) >> 2);
      if (pVVar8[uVar24].nSize < iVar7) goto LAB_002cba2d;
      pVVar8[uVar24].nSize = iVar7;
      if (((1 < uVar31) && (p->nCompls != 0)) || (p_00->nSize == 2)) {
        uVar24 = uVar24 ^ 1;
        if (pVVar2->nSize <= (int)uVar24) goto LAB_002cb973;
        piVar9 = pVVar8[uVar24].pArray;
        iVar7 = pVVar8[uVar24].nSize;
        piVar16 = piVar9;
        piVar29 = piVar9;
        if (0 < pVVar28->nSize && 0 < (long)iVar7) {
          piVar32 = piVar23 + pVVar28->nSize;
          do {
            iVar17 = *piVar16;
            if (iVar17 == *piVar23) {
              piVar16 = piVar16 + 1;
LAB_002cb91a:
              piVar23 = piVar23 + 1;
            }
            else {
              if (*piVar23 <= iVar17) goto LAB_002cb91a;
              piVar16 = piVar16 + 1;
              *piVar29 = iVar17;
              piVar29 = piVar29 + 1;
            }
          } while ((piVar16 < piVar9 + iVar7) && (piVar23 < piVar32));
        }
        for (; piVar16 < piVar9 + iVar7; piVar16 = piVar16 + 1) {
          *piVar29 = *piVar16;
          piVar29 = piVar29 + 1;
        }
        iVar7 = (int)((ulong)((long)piVar29 - (long)piVar9) >> 2);
        if (pVVar8[uVar24].nSize < iVar7) goto LAB_002cba2d;
        pVVar8[uVar24].nSize = iVar7;
      }
      uVar31 = uVar31 + 1;
    } while ((long)uVar31 < (long)p_00->nSize);
  }
  return;
}

Assistant:

void Fx_ManUpdate( Fx_Man_t * p, int iDiv, int * fWarning )
{
    Vec_Int_t * vCube, * vCube2, * vLitP = NULL, * vLitN = NULL;
    Vec_Int_t * vDiv = p->vDiv;
    int i, k, Lit0, Lit1, iVarNew = 0, RetValue, Level;
    float Diff = Vec_FltEntry(p->vWeights, iDiv) - (float)((int)Vec_FltEntry(p->vWeights, iDiv));
    assert( Diff > 0.0 && Diff < 1.0 );

    // get the divisor and select pivot variables
    p->nDivs++;
    Vec_IntClear( vDiv );
    Vec_IntAppend( vDiv, Hsh_VecReadEntry(p->pHash, iDiv) );
    Fx_ManDivFindPivots( vDiv, &Lit0, &Lit1 );
    assert( Lit0 >= 0 && Lit1 >= 0 );


    // collect single-cube-divisor cubes
    Vec_IntClear( p->vCubesS );
    if ( Vec_IntSize(vDiv) == 2 )
    {
        Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Abc_LitNot(Lit0)) );
        Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Abc_LitNot(Lit1)) );
        Vec_IntTwoRemoveCommon( Vec_WecEntry(p->vLits, Abc_LitNot(Lit0)), Vec_WecEntry(p->vLits, Abc_LitNot(Lit1)), p->vCubesS );
    }

    // collect double-cube-divisor cube pairs
    Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Lit0) );
    Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Lit1) );
    Fx_ManFindCommonPairs( p->vCubes, Vec_WecEntry(p->vLits, Lit0), Vec_WecEntry(p->vLits, Lit1), p->vCubesD, p->vCompls, vDiv, p->vCubeFree, fWarning );

    // subtract cost of single-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 1, 1 );  // remove - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 1, 1 );  // remove - update

    // mark the cubes to be removed
    Vec_WecMarkLevels( p->vCubes, p->vCubesS );
    Vec_WecMarkLevels( p->vCubes, p->vCubesD );

    // subtract cost of double-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update

    // unmark the cubes to be removed
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesS );
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesD );

    if ( Abc_Lit2Var(Lit0) == Abc_Lit2Var(Lit1) && Vec_IntSize(Hsh_VecReadEntry(p->pHash, iDiv)) == 2 )
        goto ExtractFromPairs;

    // create new divisor
    iVarNew = Vec_WecSize( p->vLits ) / 2;
    assert( Vec_IntSize(p->vVarCube) == iVarNew );
    Vec_IntPush( p->vVarCube, Vec_WecSize(p->vCubes) );
    vCube = Vec_WecPushLevel( p->vCubes );
    Vec_IntPush( vCube, iVarNew );
    if ( Vec_IntSize(vDiv) == 2 )
    {
        Vec_IntPush( vCube, Abc_LitNot(Lit0) );
        Vec_IntPush( vCube, Abc_LitNot(Lit1) );
        Level = 1 + Fx_ManComputeLevelCube( p, vCube );
    }
    else
    {
        vCube2 = Vec_WecPushLevel( p->vCubes );
        vCube = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 2 );
        Vec_IntPush( vCube2, iVarNew );
        Fx_ManDivAddLits( vCube, vCube2, vDiv );
        Level = 2 + Abc_MaxInt( Fx_ManComputeLevelCube(p, vCube), Fx_ManComputeLevelCube(p, vCube2) );
    }
    assert( Vec_IntSize(p->vLevels) == iVarNew );
    Vec_IntPush( p->vLevels, Level );
    // do not add new cubes to the matrix 
    p->nLits += Vec_IntSize( vDiv );
    // create new literals
    vLitP = Vec_WecPushLevel( p->vLits );
    vLitN = Vec_WecPushLevel( p->vLits );
    vLitP = Vec_WecEntry( p->vLits, Vec_WecSize(p->vLits) - 2 );
    // create updated single-cube divisor cubes
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
    {
        RetValue  = Vec_IntRemove1( vCube, Abc_LitNot(Lit0) );
        RetValue += Vec_IntRemove1( vCube, Abc_LitNot(Lit1) );
        assert( RetValue == 2 );
        Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 0) );
        Vec_IntPush( vLitP, Vec_WecLevelId(p->vCubes, vCube) );
        p->nLits--;
    }
    // create updated double-cube divisor cube pairs
ExtractFromPairs:
    k = 0;
    p->nCompls = 0;
    assert( Vec_IntSize(p->vCubesD) % 2 == 0 );
    assert( Vec_IntSize(p->vCubesD) == 2 * Vec_IntSize(p->vCompls) );
    for ( i = 0; i < Vec_IntSize(p->vCubesD); i += 2 )
    {
        int fCompl = Vec_IntEntry(p->vCompls, i/2);
        p->nCompls += fCompl;
        vCube  = Vec_WecEntry( p->vCubes, Vec_IntEntry(p->vCubesD, i) );
        vCube2 = Vec_WecEntry( p->vCubes, Vec_IntEntry(p->vCubesD, i+1) );
        RetValue  = Fx_ManDivRemoveLits( vCube, vDiv, fCompl );  // cube 2*i
        RetValue += Fx_ManDivRemoveLits( vCube2, vDiv, fCompl ); // cube 2*i+1
        assert( RetValue == Vec_IntSize(vDiv) || RetValue == Vec_IntSize( vDiv ) + 1);
        if ( iVarNew > 0 )
        {
            if ( Vec_IntSize(vDiv) == 2 || fCompl )
            {
                Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 1) );
                Vec_IntPush( vLitN, Vec_WecLevelId(p->vCubes, vCube) ); // MAKE SURE vCube IS SORTED BY ID
            }
            else 
            {
                Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 0) );
                Vec_IntPush( vLitP, Vec_WecLevelId(p->vCubes, vCube) ); // MAKE SURE vCube IS SORTED BY ID
            }
        }
        p->nLits -= Vec_IntSize(vDiv) + Vec_IntSize(vCube2) - 2;

        // remove second cube
        Vec_IntWriteEntry( p->vCubesD, k++, Vec_WecLevelId(p->vCubes, vCube) );
        Vec_IntClear( vCube2 ); 
    }
    assert( k == Vec_IntSize(p->vCubesD) / 2 );
    Vec_IntShrink( p->vCubesD, k );
    Vec_IntSort( p->vCubesD, 0 );
    //Vec_IntSort( vLitN, 0 );
    //Vec_IntSort( vLitP, 0 );

    // add cost of single-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 1 );  // add - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 1 );  // add - update

    // mark the cubes to be removed
    Vec_WecMarkLevels( p->vCubes, p->vCubesS );
    Vec_WecMarkLevels( p->vCubes, p->vCubesD );

    // add cost of double-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 0, 1, fWarning );  // add - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 0, 1, fWarning );  // add - update

    // unmark the cubes to be removed
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesS );
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesD );

    // Deal with SCC
    if ( Vec_IntSize( p->vSCC ) )
    {
        Vec_IntUniqify( p->vSCC );
        Fx_ManForEachCubeVec( p->vSCC, p->vCubes, vCube, i )
        {
            Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update
            Vec_IntClear( vCube );
        }
        Vec_IntClear( p->vSCC );
    }
    // add cost of the new divisor
    if ( Vec_IntSize(vDiv) > 2 )
    {
        vCube  = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 2 );
        vCube2 = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 1 );
        Fx_ManCubeSingleCubeDivisors( p, vCube,  0, 1 );  // add - update
        Fx_ManCubeSingleCubeDivisors( p, vCube2, 0, 1 );  // add - update
        Vec_IntForEachEntryStart( vCube, Lit0, i, 1 )
            Vec_WecPush( p->vLits, Lit0, Vec_WecLevelId(p->vCubes, vCube) );
        Vec_IntForEachEntryStart( vCube2, Lit0, i, 1 )
            Vec_WecPush( p->vLits, Lit0, Vec_WecLevelId(p->vCubes, vCube2) );
    }

    // remove these cubes from the lit array of the divisor
    Vec_IntForEachEntry( vDiv, Lit0, i )
    {
        Vec_IntTwoRemove( Vec_WecEntry(p->vLits, Abc_Lit2Var(Lit0)), p->vCubesD );
        if ( (p->nCompls && i > 1) || Vec_IntSize( vDiv ) == 2 ) // the last two lits are possibly complemented
            Vec_IntTwoRemove( Vec_WecEntry(p->vLits, Abc_LitNot(Abc_Lit2Var(Lit0))), p->vCubesD );
    }

}